

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationKeyByteSink::Resize
          (CollationKeyByteSink *this,int32_t appendCapacity,int32_t length)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *newBuffer;
  int32_t altCapacity;
  int32_t newCapacity;
  int32_t length_local;
  int32_t appendCapacity_local;
  CollationKeyByteSink *this_local;
  
  if ((this->super_SortKeyByteSink).buffer_ == (char *)0x0) {
    this_local._7_1_ = '\0';
  }
  else {
    newBuffer._4_4_ = (this->super_SortKeyByteSink).capacity_ << 1;
    iVar1 = length + appendCapacity * 2;
    if (newBuffer._4_4_ < iVar1) {
      newBuffer._4_4_ = iVar1;
    }
    if (newBuffer._4_4_ < 200) {
      newBuffer._4_4_ = 200;
    }
    puVar2 = CollationKey::reallocate(this->key_,newBuffer._4_4_,length);
    if (puVar2 == (uint8_t *)0x0) {
      SortKeyByteSink::SetNotOk(&this->super_SortKeyByteSink);
      this_local._7_1_ = '\0';
    }
    else {
      (this->super_SortKeyByteSink).buffer_ = (char *)puVar2;
      (this->super_SortKeyByteSink).capacity_ = newBuffer._4_4_;
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationKeyByteSink::Resize(int32_t appendCapacity, int32_t length) {
    if (buffer_ == NULL) {
        return FALSE;  // allocation failed before already
    }
    int32_t newCapacity = 2 * capacity_;
    int32_t altCapacity = length + 2 * appendCapacity;
    if (newCapacity < altCapacity) {
        newCapacity = altCapacity;
    }
    if (newCapacity < 200) {
        newCapacity = 200;
    }
    uint8_t *newBuffer = key_.reallocate(newCapacity, length);
    if (newBuffer == NULL) {
        SetNotOk();
        return FALSE;
    }
    buffer_ = reinterpret_cast<char *>(newBuffer);
    capacity_ = newCapacity;
    return TRUE;
}